

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O3

bool __thiscall
glslang::TIntermediate::areAllChildConst(TIntermediate *this,TIntermAggregate *aggrNode)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  bool bVar6;
  undefined8 *puVar7;
  long lVar3;
  
  bVar6 = true;
  if (aggrNode != (TIntermAggregate *)0x0) {
    iVar2 = (*(aggrNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(aggrNode);
    lVar3 = CONCAT44(extraout_var,iVar2);
    puVar1 = *(undefined8 **)(lVar3 + 8);
    if (puVar1 != *(undefined8 **)(lVar3 + 0x10)) {
      do {
        puVar7 = puVar1 + 1;
        plVar4 = (long *)(**(code **)(*(long *)*puVar1 + 0x18))();
        lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
        bVar6 = lVar5 != 0;
        if (lVar5 == 0) {
          return bVar6;
        }
        puVar1 = puVar7;
      } while (puVar7 != *(undefined8 **)(lVar3 + 0x10));
    }
  }
  return bVar6;
}

Assistant:

bool TIntermediate::areAllChildConst(TIntermAggregate* aggrNode)
{
    bool allConstant = true;

    // check if all the child nodes are constants so that they can be inserted into
    // the parent node
    if (aggrNode) {
        TIntermSequence& childSequenceVector = aggrNode->getSequence();
        for (TIntermSequence::iterator p  = childSequenceVector.begin();
                                       p != childSequenceVector.end(); p++) {
            if (!(*p)->getAsTyped()->getAsConstantUnion())
                return false;
        }
    }

    return allConstant;
}